

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O1

bool __thiscall Point::operator<(Point *this,Point *b)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  
  fVar1 = this->x;
  fVar2 = b->x;
  if ((1e-08 <= ABS(fVar1 - fVar2)) || (1e-08 <= ABS(this->y - b->y))) {
    if ((fVar1 < fVar2) && (bVar3 = 1, 1e-08 < ABS(fVar1 - fVar2))) goto LAB_00106755;
    if ((fVar1 <= fVar2) || (ABS(fVar2 - fVar1) <= 1e-08)) {
      bVar3 = -(1e-08 < ABS(this->y - b->y)) & -(this->y < b->y);
      goto LAB_00106755;
    }
  }
  bVar3 = 0;
LAB_00106755:
  return (bool)(bVar3 & 1);
}

Assistant:

bool Point::operator==(const Point &b) const {
    return float_eq(x, b.x) && float_eq(y, b.y);
}